

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t
decoder_inspect(aom_codec_alg_priv_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  undefined8 *size;
  uint8_t **psource;
  long lVar1;
  int iVar2;
  aom_codec_err_t aVar3;
  undefined8 *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  int i;
  Av1DecodeReturn *data2;
  uint8_t marker;
  AV1_COMMON *cm;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  uint64_t temporal_unit_size;
  size_t length_of_size;
  uint64_t frame_size;
  uint8_t *data_end;
  uint8_t *data_start;
  aom_codec_err_t res;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  aom_codec_alg_priv_t *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  aom_codec_alg_priv_t *ctx_00;
  aom_codec_alg_priv_t *in_stack_ffffffffffffffa0;
  AV1Decoder *in_stack_ffffffffffffffa8;
  size_t local_50;
  ulong local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  aom_codec_err_t local_2c;
  undefined8 *local_28;
  size_t local_20;
  uint8_t *local_18;
  long local_10;
  aom_codec_err_t local_4;
  
  local_2c = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  release_pending_output_frames(in_stack_ffffffffffffffa0);
  if ((local_18 == (uint8_t *)0x0) && (local_20 == 0)) {
    *(undefined4 *)(local_10 + 0x1a4) = 1;
    local_4 = AOM_CODEC_OK;
  }
  else if ((local_18 == (uint8_t *)0x0) || (local_20 == 0)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    *(undefined4 *)(local_10 + 0x1a4) = 0;
    local_38 = local_18;
    local_40 = local_18 + local_20;
    if (*(int *)(local_10 + 0x69e0) == 0) {
      local_48 = (long)local_40 - (long)local_18;
    }
    else {
      iVar2 = aom_uleb_decode(local_18,local_20,(uint64_t *)&stack0xffffffffffffffa8,&local_50);
      if (iVar2 != 0) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      local_38 = local_38 + local_50;
      if ((AV1Decoder *)(local_40 + -(long)local_38) < in_stack_ffffffffffffffa8) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      local_40 = local_38 + (long)in_stack_ffffffffffffffa8;
      iVar2 = aom_uleb_decode(local_38,(long)local_40 - (long)local_38,&local_48,&local_50);
      if (iVar2 != 0) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      local_38 = local_38 + local_50;
      if ((ulong)((long)local_40 - (long)local_38) < local_48) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
    }
    if (*(long *)(local_10 + 0x69f0) == 0) {
      aVar3 = init_decoder((aom_codec_alg_priv_t *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      if (aVar3 != AOM_CODEC_OK) {
        return aVar3;
      }
      local_2c = 0;
    }
    size = *(undefined8 **)(*(long *)(local_10 + 0x69f0) + 0x20);
    psource = (uint8_t **)*size;
    ctx_00 = (aom_codec_alg_priv_t *)(psource + 0x76c);
    local_2c = av1_receive_compressed_data(in_stack_ffffffffffffffa8,(size_t)size,psource);
    check_resync(in_stack_ffffffffffffff80,
                 (AV1Decoder *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (*(int *)(*(long *)(local_10 + 0x69f0) + 0x30) == 0) {
      for (; (local_38 < local_40 && (*local_38 == '\0')); local_38 = local_38 + 1) {
      }
      *(undefined4 *)(local_28 + 1) = 0xffffffff;
      lVar1._0_4_ = (ctx_00->si).is_kf;
      lVar1._4_4_ = (ctx_00->si).number_spatial_layers;
      if (lVar1 != 0) {
        for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
          if ((ctx_00->ext_refs).refs[0].store_buf_adr[(long)iVar2 + -0x10] ==
              *(uint8_t **)&(ctx_00->si).is_kf) {
            *(int *)(local_28 + 1) = iVar2;
          }
        }
      }
      *local_28 = local_38;
      *(int *)((long)local_28 + 0xc) = (ctx_00->ext_refs).refs[0].field_2.field_0.y_crop_width;
      local_4 = local_2c;
    }
    else {
      local_4 = update_error_state(ctx_00,(aom_internal_error_info *)
                                          CONCAT17(in_stack_ffffffffffffff8f,
                                                   in_stack_ffffffffffffff88));
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t decoder_inspect(aom_codec_alg_priv_t *ctx,
                                       const uint8_t *data, size_t data_sz,
                                       void *user_priv) {
  aom_codec_err_t res = AOM_CODEC_OK;

  release_pending_output_frames(ctx);

  /* Sanity checks */
  /* NULL data ptr allowed if data_sz is 0 too */
  if (data == NULL && data_sz == 0) {
    ctx->flushed = 1;
    return AOM_CODEC_OK;
  }
  if (data == NULL || data_sz == 0) return AOM_CODEC_INVALID_PARAM;

  // Reset flushed when receiving a valid frame.
  ctx->flushed = 0;

  const uint8_t *data_start = data;
  const uint8_t *data_end = data + data_sz;

  uint64_t frame_size;
  if (ctx->is_annexb) {
    // read the size of this temporal unit
    size_t length_of_size;
    uint64_t temporal_unit_size;
    if (aom_uleb_decode(data_start, data_sz, &temporal_unit_size,
                        &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (temporal_unit_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
    data_end = data_start + temporal_unit_size;

    // read the size of this frame unit
    if (aom_uleb_decode(data_start, (size_t)(data_end - data_start),
                        &frame_size, &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (frame_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
  } else {
    frame_size = (uint64_t)(data_end - data_start);
  }

  if (ctx->frame_worker == NULL) {
    res = init_decoder(ctx);
    if (res != AOM_CODEC_OK) return res;
  }
  FrameWorkerData *const frame_worker_data =
      (FrameWorkerData *)ctx->frame_worker->data1;
  AV1Decoder *const pbi = frame_worker_data->pbi;
  AV1_COMMON *const cm = &pbi->common;
#if CONFIG_INSPECTION
  frame_worker_data->pbi->inspect_cb = ctx->inspect_cb;
  frame_worker_data->pbi->inspect_ctx = ctx->inspect_ctx;
#endif
  res = av1_receive_compressed_data(frame_worker_data->pbi, (size_t)frame_size,
                                    &data_start);
  check_resync(ctx, frame_worker_data->pbi);

  if (ctx->frame_worker->had_error)
    return update_error_state(ctx, &frame_worker_data->pbi->error);

  // Allow extra zero bytes after the frame end
  while (data_start < data_end) {
    const uint8_t marker = data_start[0];
    if (marker) break;
    ++data_start;
  }

  Av1DecodeReturn *data2 = (Av1DecodeReturn *)user_priv;
  data2->idx = -1;
  if (cm->cur_frame) {
    for (int i = 0; i < REF_FRAMES; ++i)
      if (cm->ref_frame_map[i] == cm->cur_frame) data2->idx = i;
  }
  data2->buf = data_start;
  data2->show_existing = cm->show_existing_frame;
  return res;
}